

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.c
# Opt level: O0

cs_err cs_regs_access(csh ud,cs_insn *insn,uint16_t *regs_read,uint8_t *regs_read_count,
                     uint16_t *regs_write,uint8_t *regs_write_count)

{
  undefined8 in_RCX;
  undefined8 in_RDX;
  int *in_RSI;
  long in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  cs_struct *handle;
  cs_err local_4;
  
  if (in_RDI == 0) {
    local_4 = ~CS_ERR_OK;
  }
  else if (*(int *)(in_RDI + 0x60) == 0) {
    *(undefined4 *)(in_RDI + 0x50) = 7;
    local_4 = CS_ERR_DETAIL;
  }
  else if (*in_RSI == 0) {
    *(undefined4 *)(in_RDI + 0x50) = 0xb;
    local_4 = CS_ERR_SKIPDATA;
  }
  else if (*(long *)(in_RSI + 0x3c) == 0) {
    *(undefined4 *)(in_RDI + 0x50) = 7;
    local_4 = CS_ERR_DETAIL;
  }
  else if (*(long *)(in_RDI + 0xa8) == 0) {
    *(undefined4 *)(in_RDI + 0x50) = 2;
    local_4 = CS_ERR_ARCH;
  }
  else {
    (**(code **)(in_RDI + 0xa8))(in_RSI,in_RDX,in_RCX,in_R8,in_R9);
    local_4 = CS_ERR_OK;
  }
  return local_4;
}

Assistant:

CAPSTONE_API cs_regs_access(csh ud, const cs_insn *insn,
		cs_regs regs_read, uint8_t *regs_read_count,
		cs_regs regs_write, uint8_t *regs_write_count)
{
	struct cs_struct *handle;

	if (!ud)
		return -1;

	handle = (struct cs_struct *)(uintptr_t)ud;

#ifdef CAPSTONE_DIET
	// This API does not work in DIET mode
	handle->errnum = CS_ERR_DIET;
	return CS_ERR_DIET;
#else
	if (!handle->detail) {
		handle->errnum = CS_ERR_DETAIL;
		return CS_ERR_DETAIL;
	}

	if (!insn->id) {
		handle->errnum = CS_ERR_SKIPDATA;
		return CS_ERR_SKIPDATA;
	}

	if (!insn->detail) {
		handle->errnum = CS_ERR_DETAIL;
		return CS_ERR_DETAIL;
	}

	if (handle->reg_access) {
		handle->reg_access(insn, regs_read, regs_read_count, regs_write, regs_write_count);
	} else {
		// this arch is unsupported yet
		handle->errnum = CS_ERR_ARCH;
		return CS_ERR_ARCH;
	}

	return CS_ERR_OK;
#endif
}